

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Spc_Emu::load_mem_(Spc_Emu *this,byte_ *in,long size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  this->file_data = in;
  this->file_size = size;
  (this->super_Music_Emu).voice_count_ = 8;
  if ((0x1017f < size) &&
     (auVar2[0] = -(in[0xb] == ' '), auVar2[1] = -(in[0xc] == 'S'), auVar2[2] = -(in[0xd] == 'o'),
     auVar2[3] = -(in[0xe] == 'u'), auVar2[4] = -(in[0xf] == 'n'), auVar2[5] = -(in[0x10] == 'd'),
     auVar2[6] = -(in[0x11] == ' '), auVar2[7] = -(in[0x12] == 'F'), auVar2[8] = -(in[0x13] == 'i'),
     auVar2[9] = -(in[0x14] == 'l'), auVar2[10] = -(in[0x15] == 'e'),
     auVar2[0xb] = -(in[0x16] == ' '), auVar2[0xc] = -(in[0x17] == 'D'),
     auVar2[0xd] = -(in[0x18] == 'a'), auVar2[0xe] = -(in[0x19] == 't'),
     auVar2[0xf] = -(in[0x1a] == 'a'), auVar1[0] = -(*in == 'S'), auVar1[1] = -(in[1] == 'N'),
     auVar1[2] = -(in[2] == 'E'), auVar1[3] = -(in[3] == 'S'), auVar1[4] = -(in[4] == '-'),
     auVar1[5] = -(in[5] == 'S'), auVar1[6] = -(in[6] == 'P'), auVar1[7] = -(in[7] == 'C'),
     auVar1[8] = -(in[8] == '7'), auVar1[9] = -(in[9] == '0'), auVar1[10] = -(in[10] == '0'),
     auVar1[0xb] = -(in[0xb] == ' '), auVar1[0xc] = -(in[0xc] == 'S'),
     auVar1[0xd] = -(in[0xd] == 'o'), auVar1[0xe] = -(in[0xe] == 'u'),
     auVar1[0xf] = -(in[0xf] == 'n'), auVar1 = auVar1 & auVar2,
     (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff)) {
    return (blargg_err_t)0x0;
  }
  return "Wrong file type for this emulator";
}

Assistant:

blargg_err_t Spc_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,unused2 [46]) == header_size );
	file_data = in;
	file_size = size;
	set_voice_count( Snes_Spc::voice_count );
	if ( size < Snes_Spc::spc_min_file_size )
		return gme_wrong_file_type;
	return check_spc_header( in );
}